

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_trapge_32(void)

{
  uint sr;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    sr = m68ki_init_exception();
    m68ki_stack_frame_0000(m68ki_cpu.ppc,sr,4);
    m68ki_jump_vector(4);
    m68ki_remaining_cycles =
         m68ki_remaining_cycles +
         ((uint)m68ki_cpu.cyc_instruction[m68ki_cpu.ir] - (uint)m68ki_cpu.cyc_exception[4]);
    return;
  }
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  if (-1 < (char)((byte)m68ki_cpu.v_flag ^ (byte)m68ki_cpu.n_flag)) {
    m68ki_exception_trap(7);
    return;
  }
  return;
}

Assistant:

static void m68k_op_trapge_32(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		REG_PC += 4;  /* JFF increase before or 1) stackframe is incorrect 2) RTE address is wrong if trap is taken */
		if(COND_GE())
		{
			m68ki_exception_trap(EXCEPTION_TRAPV);	/* HJB 990403 */
			return;
		}
		return;
	}
	m68ki_exception_illegal();
}